

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall duckdb_parquet::RowGroup::write(RowGroup *this,int __fd,void *__buf,size_t __n)

{
  _RowGroup__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer pCVar11;
  pointer pSVar12;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"RowGroup");
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"columns",0xf,1);
  iVar4 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xc,
                     ((long)(this->columns).
                            super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                            .
                            super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->columns).
                           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           .
                           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x280 & 0xffffffff);
  iVar4 = iVar3 + iVar2 + iVar4;
  for (pCVar11 = (this->columns).
                 super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                 .
                 super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pCVar11 !=
      (this->columns).
      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
      _M_impl.super__Vector_impl_data._M_finish; pCVar11 = pCVar11 + 1) {
    iVar2 = (**(code **)(*(long *)pCVar11 + 0x18))(pCVar11,this_00);
    iVar4 = iVar4 + iVar2;
  }
  iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[6])(this_00,"total_byte_size",10,2);
  iVar6 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->total_byte_size);
  iVar7 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar8 = (*this_00->_vptr_TProtocol[6])(this_00,"num_rows",10,3);
  iVar9 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->num_rows);
  iVar10 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar9 + iVar10 + iVar6 + iVar7 + iVar8 + iVar3 + iVar5 + iVar2 + iVar4;
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"sorting_columns",0xf,4);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,0xc,
                       (ulong)((long)(this->sorting_columns).
                                     super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                                     .
                                     super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->sorting_columns).
                                    super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                                    .
                                    super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (pSVar12 = (this->sorting_columns).
                   super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                   .
                   super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pSVar12 !=
        (this->sorting_columns).
        super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
        super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
        ._M_impl.super__Vector_impl_data._M_finish; pSVar12 = pSVar12 + 1) {
      iVar2 = (**(code **)(*(long *)pSVar12 + 0x18))(pSVar12,this_00);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 2) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"file_offset",10,5);
    iVar4 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->file_offset);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 4) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"total_compressed_size",10,6);
    iVar4 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->total_compressed_size);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 8) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"ordinal",6,7);
    iVar4 = (*this_00->_vptr_TProtocol[0x11])(this_00,(ulong)(uint)(int)this->ordinal);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t RowGroup::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("RowGroup");

  xfer += oprot->writeFieldBegin("columns", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->columns.size()));
    duckdb::vector<ColumnChunk> ::const_iterator _iter150;
    for (_iter150 = this->columns.begin(); _iter150 != this->columns.end(); ++_iter150)
    {
      xfer += (*_iter150).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("total_byte_size", ::apache::thrift::protocol::T_I64, 2);
  xfer += oprot->writeI64(this->total_byte_size);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("num_rows", ::apache::thrift::protocol::T_I64, 3);
  xfer += oprot->writeI64(this->num_rows);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.sorting_columns) {
    xfer += oprot->writeFieldBegin("sorting_columns", ::apache::thrift::protocol::T_LIST, 4);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->sorting_columns.size()));
      duckdb::vector<SortingColumn> ::const_iterator _iter151;
      for (_iter151 = this->sorting_columns.begin(); _iter151 != this->sorting_columns.end(); ++_iter151)
      {
        xfer += (*_iter151).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.file_offset) {
    xfer += oprot->writeFieldBegin("file_offset", ::apache::thrift::protocol::T_I64, 5);
    xfer += oprot->writeI64(this->file_offset);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.total_compressed_size) {
    xfer += oprot->writeFieldBegin("total_compressed_size", ::apache::thrift::protocol::T_I64, 6);
    xfer += oprot->writeI64(this->total_compressed_size);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.ordinal) {
    xfer += oprot->writeFieldBegin("ordinal", ::apache::thrift::protocol::T_I16, 7);
    xfer += oprot->writeI16(this->ordinal);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}